

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

reg_object reg_init(int N,int p)

{
  reg_object prVar1;
  int local_1c;
  int i;
  reg_object obj;
  int p_local;
  int N_local;
  
  if (p < 0) {
    printf("The base case is p = 1 corresonding to either y = b0 + u or y = b1 *x + u \n");
    printf("p = Number of Independent Variables (p-1) + Dependent Variable (1) \n");
    exit(1);
  }
  prVar1 = (reg_object)malloc((long)(p + 1) * 0x20 + 0xd0);
  prVar1->N = N;
  prVar1->p = p;
  prVar1->alpha = 0.05;
  prVar1->sigma = 0.0;
  prVar1->sigma_lower = 0.0;
  prVar1->sigma_upper = 0.0;
  prVar1->R2[0] = 0.0;
  prVar1->r2 = 0.0;
  prVar1->R2[1] = 0.0;
  prVar1->r2adj = 0.0;
  prVar1->df = 0;
  prVar1->intercept = (uint)(p != 0);
  strcpy(prVar1->lls,"qr");
  prVar1->TSS = 0.0;
  prVar1->ESS = 0.0;
  prVar1->RSS = 0.0;
  prVar1->df_ESS = 0;
  prVar1->df_RSS = 0;
  prVar1->FStat = 0.0;
  prVar1->PVal = 0.0;
  prVar1->loglik = 0.0;
  prVar1->aic = 0.0;
  prVar1->bic = 0.0;
  prVar1->aicc = 0.0;
  for (local_1c = 0; local_1c < p + 1; local_1c = local_1c + 1) {
    prVar1->beta[local_1c].value = 0.0;
    prVar1->beta[local_1c].lower = 0.0;
    prVar1->beta[local_1c].upper = 0.0;
    prVar1->beta[local_1c].stdErr = 0.0;
  }
  return prVar1;
}

Assistant:

reg_object reg_init(int N, int p) {
	reg_object obj = NULL;
	int i;
	/*
	* reg_init initializes the regression object.
	* N - number of observation samples. All variables (indepnedent and dependent)
	* are of identical length N.
	*
	* p - Total Number of variables (independent and dependent).
	* The base case is p = 2 corresonding to y = b0 + b1 *x + u
	*/
	if (p < 0) {
		printf("The base case is p = 1 corresonding to either y = b0 + u or y = b1 *x + u \n");
		printf("p = Number of Independent Variables (p-1) + Dependent Variable (1) \n");
		exit(1);
	}
	obj = (reg_object)malloc(sizeof(struct reg_set) + sizeof(bparam)* (p + 1));
	obj->N = N;
	obj->p = p;
	obj->alpha = 0.05;
	obj->sigma = 0.0;
	obj->sigma_lower = 0.0;
	obj->sigma_upper = 0.0;
	obj->r2 = obj->R2[0] = 0.0;
	obj->r2adj = obj->R2[1] = 0.0;
	obj->df = 0;
	obj->intercept = (p == 0) ? 0 : 1;
	strcpy(obj->lls, "qr");

	obj->TSS = 0.0;
	obj->ESS = 0.0;
	obj->RSS = 0.0;
	obj->df_ESS = 0;
	obj->df_RSS = 0;
	obj->FStat = 0.0;
	obj->PVal = 0.0;
	obj->loglik = 0.0;
	obj->aic = 0.0;
	obj->bic = 0.0;
	obj->aicc = 0.0;

	for (i = 0; i < p + 1; ++i) {
		(obj->beta + i)->value = 0.0;
		(obj->beta + i)->lower = 0.0;
		(obj->beta + i)->upper = 0.0;
		(obj->beta + i)->stdErr = 0.0;
	}


	return obj;
}